

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerFlushOnCommit(Pager *pPager,int bCommit)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  undefined4 unaff_retaddr;
  undefined4 local_4;
  
  if (*(char *)(in_RDI + 0x10) == '\0') {
    local_4 = 1;
  }
  else if (in_ESI == 0) {
    local_4 = 0;
  }
  else if (**(long **)(in_RDI + 0x48) == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = sqlite3PCachePercentDirty((PCache *)CONCAT44(bCommit,unaff_retaddr));
    local_4 = (uint)(0x18 < iVar1);
  }
  return local_4;
}

Assistant:

static int pagerFlushOnCommit(Pager *pPager, int bCommit){
  if( pPager->tempFile==0 ) return 1;
  if( !bCommit ) return 0;
  if( !isOpen(pPager->fd) ) return 0;
  return (sqlite3PCachePercentDirty(pPager->pPCache)>=25);
}